

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic.c
# Opt level: O0

int Jac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix J,void *user_data,N_Vector tmp1,N_Vector tmp2
       ,N_Vector tmp3)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  sunrealtype *Jdata;
  sunrealtype lamda;
  sunrealtype *rdata;
  
  uVar1 = *in_RCX;
  puVar2 = (undefined8 *)SUNDenseMatrix_Data(in_RDX);
  *puVar2 = uVar1;
  return 0;
}

Assistant:

static int Jac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix J,
               void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lamda  = rdata[0]; /* set shortcut for stiffness parameter */
  sunrealtype* Jdata = SUNDenseMatrix_Data(J);

  /* Fill in Jacobian of f: set the first entry of the data array to set the (0,0) entry */
  Jdata[0] = lamda;

  return 0; /* return with success */
}